

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListWindow.cpp
# Opt level: O1

bool __thiscall cursespp::ListWindow::KeyPress(ListWindow *this,string *key)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var_00;
  size_t sVar5;
  undefined4 extraout_var;
  
  iVar3 = std::__cxx11::string::compare((char *)key);
  if (iVar3 == 0) {
    iVar3 = (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable.
              _vptr_IOrderable[0x45])(this);
    sVar5 = NO_SELECTION;
    sVar4 = CONCAT44(extraout_var_00,iVar3);
    bVar1 = 0;
    if (sVar4 != NO_SELECTION) {
      iVar3 = (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable.
                _vptr_IOrderable[0x49])(this,sVar4);
      bVar1 = (byte)iVar3;
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)key);
    if (iVar3 != 0) goto LAB_0017159b;
    iVar3 = (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable.
              _vptr_IOrderable[0x45])(this);
    sVar5 = NO_SELECTION;
    sVar4 = CONCAT44(extraout_var,iVar3);
    bVar1 = 0;
    if (sVar4 != NO_SELECTION) {
      iVar3 = (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable.
                _vptr_IOrderable[0x4a])(this,sVar4);
      bVar1 = (byte)iVar3;
    }
  }
  if (sVar4 != sVar5) {
    return (bool)(bVar1 & 1);
  }
LAB_0017159b:
  bVar2 = ScrollableWindow::KeyPress(&this->super_ScrollableWindow,key);
  return bVar2;
}

Assistant:

bool ListWindow::KeyPress(const std::string& key) {
    if (key == "KEY_ENTER") {
        auto selected = this->GetSelectedIndex();
        if (selected != NO_SELECTION) {
            return this->OnEntryActivated(selected);
        }
    }
    else if (key == "M-enter") {
        auto selected = this->GetSelectedIndex();
        if (selected != NO_SELECTION) {
            return this->OnEntryContextMenu(selected);
        }
    }
    return ScrollableWindow::KeyPress(key);
}